

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlobIOSystem.h
# Opt level: O2

void __thiscall Assimp::BlobIOStream::~BlobIOStream(BlobIOStream *this)

{
  (this->super_IOStream)._vptr_IOStream = (_func_int **)&PTR__BlobIOStream_007f3c80;
  BlobIOSystem::OnDestruct(this->creator,&this->file,this);
  if (this->buffer != (uint8_t *)0x0) {
    operator_delete__(this->buffer);
  }
  std::__cxx11::string::~string((string *)&this->file);
  return;
}

Assistant:

BlobIOStream :: ~BlobIOStream()
{
    creator->OnDestruct(file,this);
    delete[] buffer;
}